

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O0

void __thiscall mocker::Annotator::operator()(Annotator *this,ReturnStmt *node)

{
  unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
  *puVar1;
  SemanticContext *pSVar2;
  PosPair PVar3;
  PosPair PVar4;
  PosPair PVar5;
  bool bVar6;
  ReturnOutOfAFunction *this_00;
  mapped_type *pmVar7;
  IncompatibleTypes *pIVar8;
  ASTNode *pAVar9;
  mapped_type *rhs;
  NodeID local_c0;
  size_t local_b8;
  size_t sStack_b0;
  size_t local_a8;
  size_t sStack_a0;
  NodeID local_98;
  shared_ptr<mocker::ast::ASTNode> local_90;
  NodeID local_80;
  size_t local_78;
  size_t sStack_70;
  size_t local_68;
  size_t sStack_60;
  NodeID local_40;
  size_t local_38;
  size_t sStack_30;
  size_t local_28;
  size_t sStack_20;
  ReturnStmt *local_18;
  ReturnStmt *node_local;
  Annotator *this_local;
  
  local_18 = node;
  node_local = (ReturnStmt *)this;
  if ((this->inFunc & 1U) == 0) {
    this_00 = (ReturnOutOfAFunction *)__cxa_allocate_exception(0x48);
    puVar1 = this->pos;
    local_40 = ast::ASTNode::getID((ASTNode *)local_18);
    pmVar7 = std::
             unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
             ::at(puVar1,&local_40);
    local_38 = (pmVar7->first).line;
    sStack_30 = (pmVar7->first).col;
    local_28 = (pmVar7->second).line;
    sStack_20 = (pmVar7->second).col;
    PVar3.first = pmVar7->first;
    PVar3.second = pmVar7->second;
    ReturnOutOfAFunction::CompileError(this_00,PVar3);
    __cxa_throw(this_00,&ReturnOutOfAFunction::typeinfo,ReturnOutOfAFunction::~ReturnOutOfAFunction)
    ;
  }
  bVar6 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&node->expr);
  if (bVar6) {
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>
              (&local_90,&local_18->expr);
    visit(this,&local_90);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_90);
    pSVar2 = this->ctx;
    pAVar9 = &std::
              __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_18->expr)->super_ASTNode;
    local_98 = ast::ASTNode::getID(pAVar9);
    rhs = std::
          unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Type>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>_>
          ::operator[](&pSVar2->exprType,&local_98);
    bVar6 = assignable(this,&this->retType,rhs);
    if (((bVar6 ^ 0xffU) & 1) != 0) {
      pIVar8 = (IncompatibleTypes *)__cxa_allocate_exception(0x48);
      puVar1 = this->pos;
      pAVar9 = &std::
                __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_18->expr)->super_ASTNode;
      local_c0 = ast::ASTNode::getID(pAVar9);
      pmVar7 = std::
               unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
               ::at(puVar1,&local_c0);
      local_b8 = (pmVar7->first).line;
      sStack_b0 = (pmVar7->first).col;
      local_a8 = (pmVar7->second).line;
      sStack_a0 = (pmVar7->second).col;
      PVar5.first = pmVar7->first;
      PVar5.second = pmVar7->second;
      IncompatibleTypes::CompileError(pIVar8,PVar5);
      __cxa_throw(pIVar8,&IncompatibleTypes::typeinfo,IncompatibleTypes::~IncompatibleTypes);
    }
  }
  else {
    bVar6 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->retType);
    if (bVar6) {
      pIVar8 = (IncompatibleTypes *)__cxa_allocate_exception(0x48);
      puVar1 = this->pos;
      local_80 = ast::ASTNode::getID((ASTNode *)local_18);
      pmVar7 = std::
               unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
               ::at(puVar1,&local_80);
      local_78 = (pmVar7->first).line;
      sStack_70 = (pmVar7->first).col;
      local_68 = (pmVar7->second).line;
      sStack_60 = (pmVar7->second).col;
      PVar4.first = pmVar7->first;
      PVar4.second = pmVar7->second;
      IncompatibleTypes::CompileError(pIVar8,PVar4);
      __cxa_throw(pIVar8,&IncompatibleTypes::typeinfo,IncompatibleTypes::~IncompatibleTypes);
    }
  }
  return;
}

Assistant:

void operator()(ast::ReturnStmt &node) const override {
    if (!inFunc)
      throw ReturnOutOfAFunction(pos.at(node.getID()));
    if (!node.expr) {
      if (!retType)
        return;
      throw IncompatibleTypes(pos.at(node.getID()));
    }

    visit(node.expr);
    if (!assignable(retType, ctx.exprType[node.expr->getID()]))
      throw IncompatibleTypes(pos.at(node.expr->getID()));
  }